

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

Entity __thiscall entityx::EntityManager::create_from_copy(EntityManager *this,Entity original)

{
  value_type pBVar1;
  bool bVar2;
  bitset<64UL> *pbVar3;
  reference ppBVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Entity EVar5;
  BaseComponentHelper *helper;
  size_t i;
  bitset<64UL> mask;
  Entity clone;
  size_t in_stack_ffffffffffffff88;
  bitset<64UL> *this_00;
  EntityManager *in_stack_ffffffffffffffa0;
  bitset<64UL> *local_38;
  EntityManager *local_10;
  Id local_8;
  
  EVar5 = create(in_stack_ffffffffffffffa0);
  entityx::Entity::component_mask();
  local_38 = (bitset<64UL> *)0x0;
  while (this_00 = local_38,
        pbVar3 = (bitset<64UL> *)
                 Catch::clara::std::
                 vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                 ::size((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                         *)(in_RDI + 0x30)), this_00 < pbVar3) {
    ppBVar4 = Catch::clara::std::
              vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
              ::operator[]((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                            *)(in_RDI + 0x30),(size_type)local_38);
    pBVar1 = *ppBVar4;
    if ((pBVar1 != (value_type)0x0) &&
       (bVar2 = Catch::clara::std::bitset<64UL>::test(this_00,in_stack_ffffffffffffff88), bVar2)) {
      local_10 = EVar5.manager_;
      local_8 = EVar5.id_.id_;
      (*pBVar1->_vptr_BaseComponentHelper[3])(pBVar1,in_RSI,in_RDX,local_10,local_8.id_);
    }
    local_38 = (bitset<64UL> *)((long)&(local_38->super__Base_bitset<1UL>)._M_w + 1);
  }
  return EVar5;
}

Assistant:

Entity create_from_copy(Entity original) {
    assert(original.valid());
    auto clone = create();
    auto mask = original.component_mask();
    for (size_t i = 0; i < component_helpers_.size(); i++) {
      BaseComponentHelper *helper = component_helpers_[i];
      if (helper && mask.test(i))
        helper->copy_component_to(original, clone);
    }
    return clone;
  }